

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O1

mz_bool mz_zip_reader_extract_to_mem_no_alloc
                  (mz_zip_archive *pZip,mz_uint file_index,void *pBuf,size_t buf_size,mz_uint flags,
                  void *pUser_read_buf,size_t user_read_buf_size)

{
  bool bVar1;
  mz_bool mVar2;
  tinfl_status tVar3;
  size_t sVar4;
  size_t sVar5;
  mz_ulong mVar6;
  mz_zip_error mVar7;
  mz_uint64 mVar8;
  ulong uVar9;
  size_t out_buf_size;
  size_t in_buf_size;
  mz_uint32 local_header_u32 [8];
  mz_zip_archive_file_stat file_stat;
  tinfl_decompressor inflator;
  void *local_2fe8;
  ulong local_2fe0;
  ulong local_2fd8;
  long local_2fd0;
  mz_uint64 local_2fc8;
  size_t local_2fb8;
  size_t local_2fb0;
  int local_2fa8 [6];
  ushort local_2f8e;
  ushort local_2f8c;
  mz_zip_archive_file_stat local_2f80;
  tinfl_decompressor local_2b28;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  if ((((pZip->m_pState == (mz_zip_internal_state *)0x0) || (pBuf == (void *)0x0 && buf_size != 0))
      || (pUser_read_buf == (void *)0x0 && user_read_buf_size != 0)) ||
     (pZip->m_pRead == (mz_file_read_func)0x0)) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
      return 0;
    }
    return 0;
  }
  mVar2 = mz_zip_reader_file_stat(pZip,file_index,&local_2f80);
  if (mVar2 == 0) {
    return 0;
  }
  if (local_2f80.m_comp_size == 0 || local_2f80.m_is_directory != 0) {
    return 1;
  }
  if (((byte)local_2f80.m_bit_flag & 0x61) != 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
    return 0;
  }
  if (((flags >> 10 & 1) == 0) && ((local_2f80.m_method & 0xfff7) != 0)) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_METHOD;
    return 0;
  }
  mVar8 = local_2f80.m_comp_size;
  if ((flags >> 10 & 1) == 0) {
    mVar8 = local_2f80.m_uncomp_size;
  }
  if (buf_size < mVar8) {
    pZip->m_last_error = MZ_ZIP_BUF_TOO_SMALL;
    return 0;
  }
  sVar4 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2f80.m_local_header_ofs,local_2fa8,0x1e);
  if (sVar4 == 0x1e) {
    if (local_2fa8[0] == 0x4034b50) {
      local_2fe0 = local_2f80.m_comp_size;
      if ((ulong)local_2f8c + local_2f80.m_local_header_ofs + local_2f8e + local_2f80.m_comp_size +
          0x1e <= pZip->m_archive_size) {
        local_2fc8 = (ulong)local_2f8c + local_2f80.m_local_header_ofs + local_2f8e + 0x1e;
        if (((flags >> 10 & 1) == 0) && (local_2f80.m_method != 0)) {
          local_2b28.m_state = 0;
          local_2fe8 = pZip->m_pState->m_pMem;
          if (local_2fe8 == (void *)0x0) {
            if (pUser_read_buf == (void *)0x0) {
              if (0xffff < local_2f80.m_comp_size) {
                local_2fe0 = 0x10000;
              }
              local_2fe8 = (*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,local_2fe0);
              if (local_2fe8 == (void *)0x0) {
                pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
                return 0;
              }
              uVar9 = 0;
              local_2fd8 = local_2f80.m_comp_size;
            }
            else {
              uVar9 = 0;
              if (user_read_buf_size == 0) {
                return 0;
              }
              local_2fe0 = user_read_buf_size;
              local_2fd8 = local_2f80.m_comp_size;
              local_2fe8 = pUser_read_buf;
            }
          }
          else {
            local_2fe8 = (void *)((long)local_2fe8 + local_2fc8);
            local_2fd8 = 0;
            uVar9 = local_2f80.m_comp_size;
          }
          sVar4 = 0;
          local_2fd0 = 0;
          do {
            local_2fb8 = local_2f80.m_uncomp_size - sVar4;
            if (uVar9 == 0) {
              if (pZip->m_pState->m_pMem != (void *)0x0) {
                uVar9 = 0;
                goto LAB_00107dd9;
              }
              uVar9 = local_2fd8;
              if (local_2fe0 < local_2fd8) {
                uVar9 = local_2fe0;
              }
              sVar5 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2fc8,local_2fe8,uVar9);
              if (sVar5 == uVar9) {
                local_2fc8 = local_2fc8 + uVar9;
                local_2fd8 = local_2fd8 - uVar9;
                local_2fd0 = 0;
                goto LAB_00107dd9;
              }
              pZip->m_last_error = MZ_ZIP_DECOMPRESSION_FAILED;
              tVar3 = TINFL_STATUS_FAILED;
              bVar1 = false;
            }
            else {
LAB_00107dd9:
              local_2fb0 = uVar9;
              tVar3 = tinfl_decompress(&local_2b28,(mz_uint8 *)((long)local_2fe8 + local_2fd0),
                                       &local_2fb0,(mz_uint8 *)pBuf,(mz_uint8 *)((long)pBuf + sVar4)
                                       ,&local_2fb8,(uint)(local_2fd8 != 0) * 2 + 4);
              uVar9 = uVar9 - local_2fb0;
              local_2fd0 = local_2fd0 + local_2fb0;
              sVar4 = sVar4 + local_2fb8;
              bVar1 = true;
            }
          } while ((bVar1) && (tVar3 == TINFL_STATUS_NEEDS_MORE_INPUT));
          mVar2 = 0;
          if (tVar3 == TINFL_STATUS_DONE) {
            mVar7 = MZ_ZIP_UNEXPECTED_DECOMPRESSED_SIZE;
            if (sVar4 == local_2f80.m_uncomp_size) {
              mVar6 = mz_crc32(0,(mz_uint8 *)pBuf,local_2f80.m_uncomp_size);
              mVar7 = MZ_ZIP_CRC_CHECK_FAILED;
              mVar2 = 1;
              if (mVar6 == local_2f80.m_crc32) goto LAB_00107f60;
            }
            pZip->m_last_error = mVar7;
            mVar2 = 0;
          }
LAB_00107f60:
          if (pUser_read_buf == (void *)0x0 && pZip->m_pState->m_pMem == (void *)0x0) {
            (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_2fe8);
            return mVar2;
          }
          return mVar2;
        }
        sVar4 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2fc8,pBuf,mVar8);
        if (sVar4 == mVar8) {
          if ((flags >> 10 & 1) != 0) {
            return 1;
          }
          mVar6 = mz_crc32(0,(mz_uint8 *)pBuf,local_2f80.m_uncomp_size);
          if (mVar6 != local_2f80.m_crc32) {
            pZip->m_last_error = MZ_ZIP_CRC_CHECK_FAILED;
            return 0;
          }
          return 1;
        }
        goto LAB_00107f14;
      }
    }
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
  }
  else {
LAB_00107f14:
    pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
  }
  return 0;
}

Assistant:

mz_bool mz_zip_reader_extract_to_mem_no_alloc(mz_zip_archive *pZip, mz_uint file_index, void *pBuf, size_t buf_size, mz_uint flags, void *pUser_read_buf, size_t user_read_buf_size)
{
    int status = TINFL_STATUS_DONE;
    mz_uint64 needed_size, cur_file_ofs, comp_remaining, out_buf_ofs = 0, read_buf_size, read_buf_ofs = 0, read_buf_avail;
    mz_zip_archive_file_stat file_stat;
    void *pRead_buf;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
    tinfl_decompressor inflator;

    if ((!pZip) || (!pZip->m_pState) || ((buf_size) && (!pBuf)) || ((user_read_buf_size) && (!pUser_read_buf)) || (!pZip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
        return MZ_FALSE;

    /* A directory or zero length file */
    if ((file_stat.m_is_directory) || (!file_stat.m_comp_size))
        return MZ_TRUE;

    /* Encryption and patch files are not supported. */
    if (file_stat.m_bit_flag & (MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_IS_ENCRYPTED | MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_USES_STRONG_ENCRYPTION | MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_COMPRESSED_PATCH_FLAG))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

    /* This function only supports decompressing stored and deflate. */
    if ((!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (file_stat.m_method != 0) && (file_stat.m_method != MZ_DEFLATED))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_METHOD);

    /* Ensure supplied output buffer is large enough. */
    needed_size = (flags & MZ_ZIP_FLAG_COMPRESSED_DATA) ? file_stat.m_comp_size : file_stat.m_uncomp_size;
    if (buf_size < needed_size)
        return mz_zip_set_error(pZip, MZ_ZIP_BUF_TOO_SMALL);

    /* Read and parse the local directory entry. */
    cur_file_ofs = file_stat.m_local_header_ofs;
    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    cur_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) + MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    if ((cur_file_ofs + file_stat.m_comp_size) > pZip->m_archive_size)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if ((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) || (!file_stat.m_method))
    {
        /* The file is stored or the caller has requested the compressed data. */
        if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf, (size_t)needed_size) != needed_size)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
        if ((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) == 0)
        {
            if (mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf, (size_t)file_stat.m_uncomp_size) != file_stat.m_crc32)
                return mz_zip_set_error(pZip, MZ_ZIP_CRC_CHECK_FAILED);
        }
#endif

        return MZ_TRUE;
    }

    /* Decompress the file either directly from memory or from a file input buffer. */
    tinfl_init(&inflator);

    if (pZip->m_pState->m_pMem)
    {
        /* Read directly from the archive in memory. */
        pRead_buf = (mz_uint8 *)pZip->m_pState->m_pMem + cur_file_ofs;
        read_buf_size = read_buf_avail = file_stat.m_comp_size;
        comp_remaining = 0;
    }
    else if (pUser_read_buf)
    {
        /* Use a user provided read buffer. */
        if (!user_read_buf_size)
            return MZ_FALSE;
        pRead_buf = (mz_uint8 *)pUser_read_buf;
        read_buf_size = user_read_buf_size;
        read_buf_avail = 0;
        comp_remaining = file_stat.m_comp_size;
    }
    else
    {
        /* Temporarily allocate a read buffer. */
        read_buf_size = MZ_MIN(file_stat.m_comp_size, (mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE);
        if (((sizeof(size_t) == sizeof(mz_uint32))) && (read_buf_size > 0x7FFFFFFF))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (NULL == (pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, (size_t)read_buf_size)))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        read_buf_avail = 0;
        comp_remaining = file_stat.m_comp_size;
    }

    do
    {
        /* The size_t cast here should be OK because we've verified that the output buffer is >= file_stat.m_uncomp_size above */
        size_t in_buf_size, out_buf_size = (size_t)(file_stat.m_uncomp_size - out_buf_ofs);
        if ((!read_buf_avail) && (!pZip->m_pState->m_pMem))
        {
            read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
            if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf, (size_t)read_buf_avail) != read_buf_avail)
            {
                status = TINFL_STATUS_FAILED;
                mz_zip_set_error(pZip, MZ_ZIP_DECOMPRESSION_FAILED);
                break;
            }
            cur_file_ofs += read_buf_avail;
            comp_remaining -= read_buf_avail;
            read_buf_ofs = 0;
        }
        in_buf_size = (size_t)read_buf_avail;
        status = tinfl_decompress(&inflator, (mz_uint8 *)pRead_buf + read_buf_ofs, &in_buf_size, (mz_uint8 *)pBuf, (mz_uint8 *)pBuf + out_buf_ofs, &out_buf_size, TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF | (comp_remaining ? TINFL_FLAG_HAS_MORE_INPUT : 0));
        read_buf_avail -= in_buf_size;
        read_buf_ofs += in_buf_size;
        out_buf_ofs += out_buf_size;
    } while (status == TINFL_STATUS_NEEDS_MORE_INPUT);

    if (status == TINFL_STATUS_DONE)
    {
        /* Make sure the entire file was decompressed, and check its CRC. */
        if (out_buf_ofs != file_stat.m_uncomp_size)
        {
            mz_zip_set_error(pZip, MZ_ZIP_UNEXPECTED_DECOMPRESSED_SIZE);
            status = TINFL_STATUS_FAILED;
        }
#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
        else if (mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf, (size_t)file_stat.m_uncomp_size) != file_stat.m_crc32)
        {
            mz_zip_set_error(pZip, MZ_ZIP_CRC_CHECK_FAILED);
            status = TINFL_STATUS_FAILED;
        }
#endif
    }

    if ((!pZip->m_pState->m_pMem) && (!pUser_read_buf))
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);

    return status == TINFL_STATUS_DONE;
}